

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O0

int sp_zgemv(char *trans,doublecomplex alpha,SuperMatrix *A,doublecomplex *x,int incx,
            doublecomplex beta,doublecomplex *y,int incy)

{
  double dVar1;
  double dVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  char local_478 [8];
  char msg_2 [256];
  double ci_7;
  double cr_7;
  double ci_6;
  double cr_6;
  doublecomplex temp2;
  char msg_1 [256];
  double ci_5;
  double cr_5;
  double ci_4;
  double cr_4;
  char msg [256];
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  doublecomplex comp_one;
  doublecomplex comp_zero;
  int local_c0;
  int notran;
  int ky;
  int kx;
  int jy;
  int jx;
  int iy;
  int irow;
  int j;
  int i;
  int leny;
  int lenx;
  doublecomplex temp1;
  doublecomplex temp;
  int info;
  doublecomplex *Aval;
  NCformat *Astore;
  int incy_local;
  doublecomplex *y_local;
  int incx_local;
  doublecomplex *x_local;
  SuperMatrix *A_local;
  char *trans_local;
  doublecomplex beta_local;
  doublecomplex alpha_local;
  
  dVar9 = beta.i;
  dVar8 = beta.r;
  dVar10 = alpha.i;
  dVar7 = alpha.r;
  memset(&comp_one.i,0,0x10);
  comp_one.r = 0.0;
  iVar5 = strncmp(trans,"N",1);
  bVar6 = true;
  if (iVar5 != 0) {
    iVar5 = strncmp(trans,"n",1);
    bVar6 = iVar5 == 0;
  }
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  temp.i._4_4_ = 0;
  if (((bVar6) || (iVar5 = strncmp(trans,"T",1), iVar5 == 0)) ||
     (iVar5 = strncmp(trans,"C",1), iVar5 == 0)) {
    if ((A->nrow < 0) || (A->ncol < 0)) {
      temp.i._4_4_ = 3;
    }
    else if (incx == 0) {
      temp.i._4_4_ = 5;
    }
    else if (incy == 0) {
      temp.i._4_4_ = 8;
    }
  }
  else {
    temp.i._4_4_ = 1;
  }
  if (temp.i._4_4_ == 0) {
    if ((A->nrow != 0) && (A->ncol != 0)) {
      if ((dVar7 == comp_one.i) && (!NAN(dVar7) && !NAN(comp_one.i))) {
        if ((((dVar10 == comp_zero.r) && (!NAN(dVar10) && !NAN(comp_zero.r))) && (dVar8 == 1.0)) &&
           (!NAN(dVar8))) {
          if ((dVar9 == comp_one.r) && (!NAN(dVar9) && !NAN(comp_one.r))) {
            return 0;
          }
        }
      }
      if (bVar6) {
        i = A->ncol;
        j = A->nrow;
      }
      else {
        i = A->nrow;
        j = A->ncol;
      }
      if (incx < 1) {
        notran = -(i + -1) * incx;
      }
      else {
        notran = 0;
      }
      if (incy < 1) {
        local_c0 = -(j + -1) * incy;
      }
      else {
        local_c0 = 0;
      }
      if (((dVar8 != 1.0) || (NAN(dVar8))) ||
         ((dVar9 != comp_one.r || (NAN(dVar9) || NAN(comp_one.r))))) {
        if (incy == 1) {
          if (((dVar8 != comp_one.i) || (NAN(dVar8) || NAN(comp_one.i))) ||
             ((dVar9 != comp_zero.r || (NAN(dVar9) || NAN(comp_zero.r))))) {
            for (irow = 0; irow < j; irow = irow + 1) {
              dVar1 = y[irow].r;
              dVar2 = y[irow].i;
              y[irow].r = dVar8 * y[irow].r + -(dVar9 * y[irow].i);
              y[irow].i = dVar9 * dVar1 + dVar8 * dVar2;
            }
          }
          else {
            for (irow = 0; irow < j; irow = irow + 1) {
              y[irow].r = comp_one.i;
              y[irow].i = comp_zero.r;
            }
          }
        }
        else {
          jy = local_c0;
          if ((((dVar8 != comp_one.i) || (NAN(dVar8) || NAN(comp_one.i))) || (dVar9 != comp_zero.r))
             || (NAN(dVar9) || NAN(comp_zero.r))) {
            for (irow = 0; irow < j; irow = irow + 1) {
              dVar1 = y[jy].r;
              dVar2 = y[jy].i;
              y[jy].r = dVar8 * y[jy].r + -(dVar9 * y[jy].i);
              y[jy].i = dVar9 * dVar1 + dVar8 * dVar2;
              jy = incy + jy;
            }
          }
          else {
            for (irow = 0; irow < j; irow = irow + 1) {
              y[jy].r = comp_one.i;
              y[jy].i = comp_zero.r;
              jy = incy + jy;
            }
          }
        }
      }
      if ((dVar7 == comp_one.i) && (!NAN(dVar7) && !NAN(comp_one.i))) {
        if ((dVar10 == comp_zero.r) && (!NAN(dVar10) && !NAN(comp_zero.r))) {
          return 0;
        }
      }
      if (bVar6) {
        kx = notran;
        if (incy == 1) {
          for (iy = 0; iy < A->ncol; iy = iy + 1) {
            if ((((x[kx].r != comp_one.i) || (NAN(x[kx].r) || NAN(comp_one.i))) ||
                (x[kx].i != comp_zero.r)) || (NAN(x[kx].i) || NAN(comp_zero.r))) {
              dVar8 = dVar7 * x[kx].r + -(dVar10 * x[kx].i);
              dVar9 = dVar10 * x[kx].r + dVar7 * x[kx].i;
              for (irow = *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)iy * 4);
                  irow < *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)(iy + 1) * 4);
                  irow = irow + 1) {
                iVar5 = *(int *)(*(long *)((long)pvVar3 + 0x10) + (long)irow * 4);
                dVar1 = *(double *)(lVar4 + (long)irow * 0x10);
                dVar2 = *(double *)(lVar4 + (long)irow * 0x10 + 8);
                y[iVar5].r = y[iVar5].r +
                             dVar8 * *(double *)(lVar4 + (long)irow * 0x10) +
                             -(dVar9 * *(double *)(lVar4 + (long)irow * 0x10 + 8));
                y[iVar5].i = y[iVar5].i + dVar9 * dVar1 + dVar8 * dVar2;
              }
            }
            kx = incx + kx;
          }
        }
        else {
          sprintf((char *)&cr_4,"%s at line %d in file %s\n","Not implemented.",0x22b,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
                 );
          superlu_abort_and_exit((char *)&cr_4);
        }
      }
      else {
        iVar5 = strncmp(trans,"T",1);
        if ((iVar5 == 0) || (iVar5 = strncmp(trans,"t",1), iVar5 == 0)) {
          ky = local_c0;
          if (incx == 1) {
            for (iy = 0; iy < A->ncol; iy = iy + 1) {
              temp1.i = comp_one.i;
              temp.r = comp_zero.r;
              for (irow = *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)iy * 4);
                  irow < *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)(iy + 1) * 4);
                  irow = irow + 1) {
                iVar5 = *(int *)(*(long *)((long)pvVar3 + 0x10) + (long)irow * 4);
                temp1.i = temp1.i + *(double *)(lVar4 + (long)irow * 0x10) * x[iVar5].r +
                                    -(*(double *)(lVar4 + (long)irow * 0x10 + 8) * x[iVar5].i);
                temp.r = temp.r + *(double *)(lVar4 + (long)irow * 0x10 + 8) * x[iVar5].r +
                                  *(double *)(lVar4 + (long)irow * 0x10) * x[iVar5].i;
              }
              y[ky].r = y[ky].r + dVar7 * temp1.i + -(dVar10 * temp.r);
              y[ky].i = y[ky].i + dVar10 * temp1.i + dVar7 * temp.r;
              ky = incy + ky;
            }
          }
          else {
            sprintf((char *)&temp2.i,"%s at line %d in file %s\n","Not implemented.",0x23d,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
                   );
            superlu_abort_and_exit((char *)&temp2.i);
          }
        }
        else {
          ky = local_c0;
          if (incx == 1) {
            for (iy = 0; iy < A->ncol; iy = iy + 1) {
              temp1.i = comp_one.i;
              temp.r = comp_zero.r;
              for (irow = *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)iy * 4);
                  irow < *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)(iy + 1) * 4);
                  irow = irow + 1) {
                iVar5 = *(int *)(*(long *)((long)pvVar3 + 0x10) + (long)irow * 4);
                dVar8 = *(double *)(lVar4 + (long)irow * 0x10);
                dVar9 = -*(double *)(lVar4 + (long)irow * 0x10 + 8);
                temp1.i = temp1.i + dVar8 * x[iVar5].r + -(dVar9 * x[iVar5].i);
                temp.r = temp.r + dVar9 * x[iVar5].r + dVar8 * x[iVar5].i;
              }
              y[ky].r = y[ky].r + dVar7 * temp1.i + -(dVar10 * temp.r);
              y[ky].i = y[ky].i + dVar10 * temp1.i + dVar7 * temp.r;
              ky = incy + ky;
            }
          }
          else {
            sprintf(local_478,"%s at line %d in file %s\n","Not implemented.",0x252,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
                   );
            superlu_abort_and_exit(local_478);
          }
        }
      }
    }
  }
  else {
    input_error("sp_zgemv ",(int *)((long)&temp.i + 4));
  }
  return 0;
}

Assistant:

int
sp_zgemv(char *trans, doublecomplex alpha, SuperMatrix *A, doublecomplex *x, 
	 int incx, doublecomplex beta, doublecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int info;
    doublecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    doublecomplex comp_zero = {0.0, 0.0};
    doublecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_zgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (z_eq(&alpha, &comp_zero) && z_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !z_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  zz_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    zz_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( z_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !z_eq(&x[jx], &comp_zero) ) {
		    zz_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			zz_mult(&temp1, &temp,  &Aval[i]);
			z_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    zz_mult(&temp1, &Aval[i], &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	doublecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    zz_mult(&temp1, &temp2, &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}